

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O2

void __thiscall
geometrycentral::DependentQuantityD<Eigen::SparseMatrix<std::complex<double>,_0,_int>_>::
~DependentQuantityD(DependentQuantityD<Eigen::SparseMatrix<std::complex<double>,_0,_int>_> *this)

{
  DependentQuantity::~DependentQuantity(&this->super_DependentQuantity);
  operator_delete(this);
  return;
}

Assistant:

DependentQuantityD(){}